

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::AddLinkObjects
          (cmComputeLinkDepends *this,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *objs)

{
  pointer pcVar1;
  cmLinkItem *obj;
  pointer item;
  
  pcVar1 = (objs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (item = (objs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
              super__Vector_impl_data._M_start; item != pcVar1; item = item + 1) {
    AddLinkObject(this,item);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkObjects(std::vector<cmLinkItem> const& objs)
{
  for (cmLinkItem const& obj : objs) {
    this->AddLinkObject(obj);
  }
}